

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

bool VulkanUtilities::SetupDebugReport
               (VkInstance instance,VkDebugReportFlagBitsEXT flags,void *pUserData)

{
  Char *Message;
  undefined1 local_78 [8];
  string msg;
  undefined4 local_50;
  VkResult err;
  VkDebugReportCallbackCreateInfoEXT CallbackCI;
  void *pUserData_local;
  VkDebugReportFlagBitsEXT flags_local;
  VkInstance instance_local;
  
  CallbackCI.pUserData = pUserData;
  (anonymous_namespace)::CreateDebugReportCallbackEXT =
       (*vkGetInstanceProcAddr)(instance,"vkCreateDebugReportCallbackEXT");
  (anonymous_namespace)::DestroyDebugReportCallbackEXT =
       (long)(*vkGetInstanceProcAddr)(instance,"vkDestroyDebugReportCallbackEXT");
  if (((anonymous_namespace)::CreateDebugReportCallbackEXT == (PFN_vkVoidFunction)0x0) ||
     ((PFN_vkVoidFunction)(anonymous_namespace)::DestroyDebugReportCallbackEXT ==
      (PFN_vkVoidFunction)0x0)) {
    instance_local._7_1_ = false;
  }
  else {
    memset(&local_50,0,0x28);
    local_50 = 0x3b9af4f8;
    CallbackCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    CallbackCI._4_4_ = 0;
    CallbackCI._16_8_ = anon_unknown_0::DebugReportCallback;
    CallbackCI.pfnCallback = (PFN_vkDebugReportCallbackEXT)CallbackCI.pUserData;
    CallbackCI.pNext._0_4_ = flags;
    msg.field_2._12_4_ =
         (*(anonymous_namespace)::CreateDebugReportCallbackEXT)
                   (instance,&local_50,0,&(anonymous_namespace)::DbgCallback);
    if (msg.field_2._12_4_ != 0) {
      Diligent::FormatString<char[39]>
                ((string *)local_78,(char (*) [39])"Failed to create debug report callback");
      Message = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (Message,"SetupDebugReport",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0x108);
      std::__cxx11::string::~string((string *)local_78);
    }
    instance_local._7_1_ = msg.field_2._12_4_ == 0;
  }
  return instance_local._7_1_;
}

Assistant:

bool SetupDebugReport(VkInstance               instance,
                      VkDebugReportFlagBitsEXT flags,
                      void*                    pUserData)
{
    CreateDebugReportCallbackEXT  = reinterpret_cast<PFN_vkCreateDebugReportCallbackEXT>(vkGetInstanceProcAddr(instance, "vkCreateDebugReportCallbackEXT"));
    DestroyDebugReportCallbackEXT = reinterpret_cast<PFN_vkDestroyDebugReportCallbackEXT>(vkGetInstanceProcAddr(instance, "vkDestroyDebugReportCallbackEXT"));
    if (CreateDebugReportCallbackEXT == nullptr || DestroyDebugReportCallbackEXT == nullptr)
        return false;

    VkDebugReportCallbackCreateInfoEXT CallbackCI{};
    CallbackCI.sType       = VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT;
    CallbackCI.pNext       = nullptr;
    CallbackCI.flags       = flags;
    CallbackCI.pfnCallback = DebugReportCallback;
    CallbackCI.pUserData   = pUserData;

    auto err = CreateDebugReportCallbackEXT(instance, &CallbackCI, nullptr, &DbgCallback);
    VERIFY(err == VK_SUCCESS, "Failed to create debug report callback");
    return err == VK_SUCCESS;
}